

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void err_argmsg(lua_State *L,int narg,char *msg)

{
  char *pcVar1;
  char *fname;
  char *local_20;
  
  local_20 = "?";
  pcVar1 = lj_debug_funcname(L,L->base + -1,&local_20);
  if (0xffffd8f0 < (uint)narg) {
    narg = narg + (int)((ulong)((long)L->top - (long)L->base) >> 3) + 1;
  }
  if (((pcVar1 == (char *)0x0) || (pcVar1[3] != 'h')) || (narg = narg - 1, narg != 0)) {
    pcVar1 = lj_strfmt_pushf(L,lj_err_allmsg + 0x1e7,(ulong)(uint)narg,local_20,msg);
  }
  else {
    pcVar1 = lj_strfmt_pushf(L,lj_err_allmsg + 0x1c9,local_20,msg);
  }
  lj_err_callermsg(L,pcVar1);
}

Assistant:

static void err_argmsg(lua_State *L, int narg,
					    const char *msg)
{
  const char *fname = "?";
  const char *ftype = lj_debug_funcname(L, L->base - 1, &fname);
  if (narg < 0 && narg > LUA_REGISTRYINDEX)
    narg = (int)(L->top - L->base) + narg + 1;
  if (ftype && ftype[3] == 'h' && --narg == 0)  /* Check for "method". */
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADSELF), fname, msg);
  else
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADARG), narg, fname, msg);
  lj_err_callermsg(L, msg);
}